

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdAddBlindTxOutData(void *handle,void *blind_handle,uint32_t index,char *confidential_key)

{
  pointer pcVar1;
  undefined8 uVar2;
  size_t sVar3;
  CfdException *pCVar4;
  undefined1 local_c0 [32];
  Pubkey local_a0;
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  Pubkey local_68;
  string local_50;
  
  cfd::Initialize();
  pcVar1 = local_c0 + 0x10;
  local_c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"BlindTxData","");
  cfd::capi::CheckBuffer(blind_handle,(string *)local_c0);
  if ((pointer)local_c0._0_8_ != pcVar1) {
    operator_delete((void *)local_c0._0_8_);
  }
  if (*(long *)((long)blind_handle + 0x18) != 0) {
    if (confidential_key != (char *)0x0) {
      local_c0._0_8_ = local_c0._0_8_ & 0xffffffff00000000;
      cfd::core::Pubkey::Pubkey((Pubkey *)(local_c0 + 8));
      cfd::core::Pubkey::Pubkey(&local_a0);
      local_80 = 0;
      local_78._M_local_buf[0] = '\0';
      local_c0._0_4_ = index;
      local_88._M_p = (pointer)&local_78;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar3 = strlen(confidential_key);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,confidential_key,confidential_key + sVar3);
      cfd::core::Pubkey::Pubkey(&local_68,&local_50);
      uVar2 = local_c0._8_8_;
      local_c0._8_8_ =
           local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_c0._16_8_ =
           local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_c0._24_8_ =
           local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pointer)uVar2 != (pointer)0x0) {
        operator_delete((void *)uVar2);
        if (local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>::push_back
                (*(vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> **)
                  ((long)blind_handle + 0x18),(value_type *)local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_p != &local_78) {
        operator_delete(local_88._M_p);
      }
      if (local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((pointer)local_c0._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_c0._8_8_);
      }
      return 0;
    }
    local_c0._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_c0._8_4_ = 0x4e6;
    local_c0._16_8_ = "CfdAddBlindTxOutData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_c0,kCfdLogLevelWarning,"confidential key is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_c0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,"Failed to parameter. confidential key is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_c0._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_c0._8_4_ = 0x4e0;
  local_c0._16_8_ = "CfdAddBlindTxOutData";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_c0,kCfdLogLevelWarning,"buffer state is illegal.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"Failed to parameter. buffer state is illegal.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdOutOfRangeError,(string *)local_c0);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddBlindTxOutData(
    void* handle, void* blind_handle, uint32_t index,
    const char* confidential_key) {
  try {
    cfd::Initialize();
    CheckBuffer(blind_handle, kPrefixBlindTxData);

    CfdCapiBlindTxData* buffer =
        static_cast<CfdCapiBlindTxData*>(blind_handle);
    if (buffer->txout_blind_keys == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer state is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. buffer state is illegal.");
    }
    if (confidential_key == nullptr) {
      warn(CFD_LOG_SOURCE, "confidential key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential key is null.");
    }

    TxOutBlindKeys params;
    params.index = index;
    params.confidential_key = Pubkey(confidential_key);

    buffer->txout_blind_keys->push_back(params);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}